

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopl_file.c
# Opt level: O0

int WOPL_SaveInstToMem(WOPIFile *file,void *dest_mem,size_t length,uint16_t version)

{
  char *pcVar1;
  uint16_t ins_size;
  uint8_t *cursor;
  uint16_t version_local;
  size_t length_local;
  void *dest_mem_local;
  WOPIFile *file_local;
  
  pcVar1 = wopli_magic;
  if (dest_mem == (void *)0x0) {
    file_local._4_4_ = 6;
  }
  else {
    cursor._6_2_ = version;
    if (version == 0) {
      cursor._6_2_ = 3;
    }
    if (length < 0xb) {
      file_local._4_4_ = 2;
    }
    else {
      *(undefined8 *)dest_mem = *(undefined8 *)wopli_magic;
      *(undefined2 *)((long)dest_mem + 8) = *(undefined2 *)(pcVar1 + 8);
      *(char *)((long)dest_mem + 10) = pcVar1[10];
      if (length - 0xb < 2) {
        file_local._4_4_ = 2;
      }
      else {
        fromUint16LE(cursor._6_2_,(uint8_t *)((long)dest_mem + 0xb));
        if (length == 0xd) {
          file_local._4_4_ = 2;
        }
        else {
          *(uint8_t *)((long)dest_mem + 0xd) = file->is_drum;
          if (length - 0xe < 0x3e) {
            file_local._4_4_ = 2;
          }
          else {
            WOPL_writeInstrument(&file->inst,(uint8_t *)((long)dest_mem + 0xe),cursor._6_2_,'\0');
            file_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

int WOPL_SaveInstToMem(WOPIFile *file, void *dest_mem, size_t length, uint16_t version)
{
    uint8_t *cursor = (uint8_t *)dest_mem;
    uint16_t ins_size;

    if(!cursor)
        return WOPL_ERR_NULL_POINTER;

    if(version == 0)
        version = wopl_latest_version;

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    {/* Magic number */
        if(length < 11)
            return WOPL_ERR_UNEXPECTED_ENDING;
        memcpy(cursor, wopli_magic, 11);
        GO_FORWARD(11);
    }

    {/* Version code */
        if(length < 2)
            return WOPL_ERR_UNEXPECTED_ENDING;
        fromUint16LE(version, cursor);
        GO_FORWARD(2);
    }

    {/* is drum flag */
        if(length < 1)
            return WOPL_ERR_UNEXPECTED_ENDING;
        *cursor = file->is_drum;
        GO_FORWARD(1);
    }

    if(version > 2)
        /* Skip sounding delays are not part of single-instrument file
         * two sizes of uint16_t will be subtracted */
        ins_size = WOPL_INST_SIZE_V3 - (sizeof(uint16_t) * 2);
    else
        ins_size = WOPL_INST_SIZE_V2;

    if(length < ins_size)
        return WOPL_ERR_UNEXPECTED_ENDING;

    WOPL_writeInstrument(&file->inst, cursor, version, 0);
    GO_FORWARD(ins_size);

    return WOPL_ERR_OK;
#undef GO_FORWARD
}